

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

ReadFileResult
anon_unknown.dwarf_a6dc0e::EnvironmentHelper
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *out,Value *value)

{
  bool bVar1;
  String local_48;
  Value *local_20;
  Value *value_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *out_local;
  
  local_20 = value;
  value_local = (Value *)out;
  if ((value != (Value *)0x0) && (bVar1 = Json::Value::isNull(value), !bVar1)) {
    bVar1 = Json::Value::isString(local_20);
    if (!bVar1) {
      return INVALID_PRESET;
    }
    Json::Value::asString_abi_cxx11_(&local_48,local_20);
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)value_local,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    return READ_OK;
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)value_local);
  return READ_OK;
}

Assistant:

ReadFileResult EnvironmentHelper(cm::optional<std::string>& out,
                                 const Json::Value* value)
{
  if (!value || value->isNull()) {
    out = cm::nullopt;
    return ReadFileResult::READ_OK;
  }
  if (value->isString()) {
    out = value->asString();
    return ReadFileResult::READ_OK;
  }
  return ReadFileResult::INVALID_PRESET;
}